

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

uint32_t helper_rsqrte_f16_arm(uint32_t input,void *fpstp)

{
  float16 fVar1;
  int iVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  float16 local_3a;
  float16 nan;
  uint64_t f64_frac;
  uint16_t f16_frac;
  int f16_exp;
  _Bool f16_sign;
  uint16_t val;
  float_status *pfStack_20;
  float16 f16;
  float_status *s;
  void *fpstp_local;
  uint32_t input_local;
  
  pfStack_20 = (float_status *)fpstp;
  s = (float_status *)fpstp;
  fpstp_local._0_4_ = input;
  f16_exp._0_2_ = float16_squash_input_denormal_arm((float16)input,(float_status *)fpstp);
  f16_exp._2_2_ = (float16)f16_exp;
  iVar2 = float16_is_neg((float16)f16_exp);
  f16_frac._1_1_ = iVar2 != 0;
  f64_frac._4_4_ = extract32((uint)(float16)f16_exp,10,5);
  uVar3 = extract32((uint)(float16)f16_exp,0,10);
  f64_frac._2_2_ = (ushort)uVar3;
  iVar2 = float16_is_any_nan(f16_exp._2_2_);
  if (iVar2 == 0) {
    iVar2 = float16_is_zero(f16_exp._2_2_);
    if (iVar2 == 0) {
      if ((f16_frac._1_1_ & 1) == 0) {
        iVar2 = float16_is_infinity(f16_exp._2_2_);
        if (iVar2 == 0) {
          uVar4 = recip_sqrt_estimate((int *)((long)&f64_frac + 4),0x2c,
                                      (ulong)f64_frac._2_2_ << 0x2a);
          uVar3 = deposit32(0,0xf,1,(uint)(f16_frac._1_1_ & 1));
          f16_exp._0_2_ = (float16)uVar3;
          uVar3 = deposit32(uVar3 & 0xffff,10,5,f64_frac._4_4_);
          f16_exp._0_2_ = (float16)uVar3;
          uVar4 = extract64(uVar4,0x2c,8);
          uVar3 = deposit32(uVar3 & 0xffff,2,8,(uint32_t)uVar4);
          fpstp_local._4_4_ = uVar3 & 0xffff;
        }
        else {
          fpstp_local._4_4_ = 0;
        }
      }
      else {
        float_raise_arm('\x01',pfStack_20);
        fVar1 = float16_default_nan_arm(pfStack_20);
        fpstp_local._4_4_ = (uint)fVar1;
      }
    }
    else {
      float_raise_arm('\x04',pfStack_20);
      fVar1 = float16_set_sign(0x7c00,(uint)(f16_frac._1_1_ & 1));
      fpstp_local._4_4_ = (uint)fVar1;
    }
  }
  else {
    local_3a = f16_exp._2_2_;
    iVar2 = float16_is_signaling_nan_arm(f16_exp._2_2_,pfStack_20);
    if (iVar2 != 0) {
      float_raise_arm('\x01',pfStack_20);
      local_3a = float16_silence_nan_arm(f16_exp._2_2_,pfStack_20);
    }
    if (pfStack_20->default_nan_mode != '\0') {
      local_3a = float16_default_nan_arm(pfStack_20);
    }
    fpstp_local._4_4_ = (uint)local_3a;
  }
  return fpstp_local._4_4_;
}

Assistant:

uint32_t HELPER(rsqrte_f16)(uint32_t input, void *fpstp)
{
    float_status *s = fpstp;
    float16 f16 = float16_squash_input_denormal(input, s);
    uint16_t val = float16_val(f16);
    bool f16_sign = float16_is_neg(f16);
    int f16_exp = extract32(val, 10, 5);
    uint16_t f16_frac = extract32(val, 0, 10);
    uint64_t f64_frac;

    if (float16_is_any_nan(f16)) {
        float16 nan = f16;
        if (float16_is_signaling_nan(f16, s)) {
            float_raise(float_flag_invalid, s);
            nan = float16_silence_nan(f16, s);
        }
        if (s->default_nan_mode) {
            nan =  float16_default_nan(s);
        }
        return nan;
    } else if (float16_is_zero(f16)) {
        float_raise(float_flag_divbyzero, s);
        return float16_set_sign(float16_infinity, f16_sign);
    } else if (f16_sign) {
        float_raise(float_flag_invalid, s);
        return float16_default_nan(s);
    } else if (float16_is_infinity(f16)) {
        return float16_zero;
    }

    /* Scale and normalize to a double-precision value between 0.25 and 1.0,
     * preserving the parity of the exponent.  */

    f64_frac = ((uint64_t) f16_frac) << (52 - 10);

    f64_frac = recip_sqrt_estimate(&f16_exp, 44, f64_frac);

    /* result = sign : result_exp<4:0> : estimate<7:0> : Zeros(2) */
    val = deposit32(0, 15, 1, f16_sign);
    val = deposit32(val, 10, 5, f16_exp);
    val = deposit32(val, 2, 8, extract64(f64_frac, 52 - 8, 8));
    return make_float16(val);
}